

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer.cpp
# Opt level: O0

void CGL::Viewer::resize_callback(GLFWwindow *window,int width,int height)

{
  GLFWwindow *in_RDI;
  int h;
  int w;
  int local_18;
  int local_14 [5];
  
  glfwGetFramebufferSize(in_RDI,local_14,&local_18);
  _buffer_w = (size_t)local_14[0];
  _buffer_h = (size_t)local_18;
  glViewport(0,0,local_14[0],local_18);
  OSDText::resize(osd_text,_buffer_w,_buffer_h);
  if (renderer != (long *)0x0) {
    (**(code **)(*renderer + 0x20))(renderer,_buffer_w,_buffer_h);
  }
  return;
}

Assistant:

void Viewer::resize_callback( GLFWwindow* window, int width, int height ) {

  // get framebuffer size
  int w, h; 
  glfwGetFramebufferSize(window, &w, &h );
    
  // update buffer size
  buffer_w = w; buffer_h = h;
  glViewport( 0, 0, buffer_w, buffer_h );

  // resize on-screen display
  osd_text->resize(buffer_w, buffer_h);

  // resize render if there is a user space renderer
  if (renderer) renderer->resize( buffer_w, buffer_h );  
}